

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O0

void __thiscall QPropertyAnimation::setTargetObject(QPropertyAnimation *this,QObject *target)

{
  long lVar1;
  parameter_type pVar2;
  QPropertyAnimationPrivate *pQVar3;
  parameter_type pQVar4;
  parameter_type in_RSI;
  QPropertyAnimationPrivate *in_RDI;
  long in_FS_OFFSET;
  offset_in_QObject_to_subr unaff_retaddr;
  ConnectionType in_stack_00000020;
  QObject *oldTarget;
  QPropertyAnimationPrivate *d;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Object *in_stack_ffffffffffffff88;
  QMessageLogger *in_stack_ffffffffffffff90;
  QPropertyAnimationPrivate *this_00;
  anon_class_8_1_54a39804_for_o *in_stack_ffffffffffffffd0;
  ContextType *in_stack_ffffffffffffffd8;
  Object *in_stack_ffffffffffffffe0;
  QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
  *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QPropertyAnimation *)0x682dd5);
  pVar2 = QObjectBindableProperty::operator_cast_to_State
                    ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                      *)0x682de8);
  if (pVar2 == Stopped) {
    QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper
              ((QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                *)in_stack_ffffffffffffff90);
    pQVar4 = QPropertyData<QObject_*>::valueBypassingBindings
                       (&(pQVar3->targetObject).super_QPropertyData<QObject_*>);
    if (pQVar4 != in_RSI) {
      if (pQVar4 != (parameter_type)0x0) {
        QObject::disconnect<void(QObject::*)(QObject*)>
                  (in_stack_ffffffffffffff88,0,(QObject *)in_RDI,
                   (void **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      QPropertyData<QObject_*>::setValueBypassingBindings
                (&(pQVar3->targetObject).super_QPropertyData<QObject_*>,in_RSI);
      if (in_RSI != (parameter_type)0x0) {
        QObject::
        connect<void(QObject::*)(QObject*),QPropertyAnimation::setTargetObject(QObject*)::__0>
                  (in_stack_ffffffffffffffe0,unaff_retaddr,in_stack_ffffffffffffffd8,
                   in_stack_ffffffffffffffd0,in_stack_00000020);
        QMetaObject::Connection::~Connection((Connection *)in_RDI);
      }
      QPropertyAnimationPrivate::updateMetaProperty(this_00);
      QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
      ::notify(in_stack_fffffffffffffff0);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffd8,
               "QPropertyAnimation::setTargetObject: you can\'t change the target of a running animation"
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyAnimation::setTargetObject(QObject *target)
{
    Q_D(QPropertyAnimation);
    if (d->state != QAbstractAnimation::Stopped) {
        qWarning("QPropertyAnimation::setTargetObject: you can't change the target of a running animation");
        return;
    }

    d->targetObject.removeBindingUnlessInWrapper();
    const QObject *oldTarget = d->targetObject.valueBypassingBindings();
    if (oldTarget == target)
        return;

    if (oldTarget != nullptr)
        QObject::disconnect(oldTarget, &QObject::destroyed, this, nullptr);
    d->targetObject.setValueBypassingBindings(target);

    if (target != nullptr) {
        QObject::connect(target, &QObject::destroyed, this,
                         [d] { d->targetObjectDestroyed(); });
    }
    d->updateMetaProperty();
    d->targetObject.notify();
}